

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

Arg * __thiscall
fmt::internal::FormatterBase::next_arg(Arg *__return_storage_ptr__,FormatterBase *this,char **error)

{
  uint arg_index;
  
  arg_index = this->next_arg_index_;
  if ((int)arg_index < 0) {
    *error = "cannot switch from manual to automatic argument indexing";
    *(undefined8 *)&__return_storage_ptr__->type = 0;
    *(undefined8 *)&__return_storage_ptr__->field_0x18 = 0;
    (__return_storage_ptr__->super_Value).field_0.long_long_value = 0;
    (__return_storage_ptr__->super_Value).field_0.string.size = 0;
  }
  else {
    this->next_arg_index_ = arg_index + 1;
    do_get_arg(__return_storage_ptr__,this,arg_index,error);
  }
  return __return_storage_ptr__;
}

Assistant:

Arg next_arg(const char *&error) {
    if (next_arg_index_ >= 0)
      return do_get_arg(internal::to_unsigned(next_arg_index_++), error);
    error = "cannot switch from manual to automatic argument indexing";
    return Arg();
  }